

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error(ot::commissioner::PendingOperationalDataset_const&)>
          (Action<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
           *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<ot::commissioner::Error> *this_00;
  tuple<const_ot::commissioner::PendingOperationalDataset_&> local_70;
  Result local_68;
  ReferenceOrValueWrapper<ot::commissioner::Error> local_40;
  tuple<const_ot::commissioner::PendingOperationalDataset_&> *local_18;
  ArgumentTuple *args_local;
  Action<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
  *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  this = args_local;
  std::tuple<const_ot::commissioner::PendingOperationalDataset_&>::tuple(&local_70,local_18);
  Action<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>::Perform
            (&local_68,
             (Action<ot::commissioner::Error_(const_ot::commissioner::PendingOperationalDataset_&)>
              *)this,&local_70);
  ReferenceOrValueWrapper<ot::commissioner::Error>::ReferenceOrValueWrapper(&local_40,&local_68);
  ActionResultHolder(this_00,&local_40);
  ReferenceOrValueWrapper<ot::commissioner::Error>::~ReferenceOrValueWrapper(&local_40);
  ot::commissioner::Error::~Error(&local_68);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }